

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_io_object.hpp
# Opt level: O0

void __thiscall
asio::
basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
::basic_io_object(basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
                  *this,io_context *io_context)

{
  waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
  *pwVar1;
  waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
  *in_RDI;
  implementation_type *in_stack_ffffffffffffffc8;
  implementation_type *in_stack_ffffffffffffffe0;
  
  pwVar1 = use_service<asio::waitable_timer_service<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
                     ((io_context *)0x118c62);
  (in_RDI->
  super_service_base<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  ).super_service.super_service._vptr_service = (_func_int **)pwVar1;
  detail::
  deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  ::implementation_type::implementation_type(in_stack_ffffffffffffffe0);
  waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
  ::construct(in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

explicit basic_io_object(asio::io_context& io_context)
    : service_(&asio::use_service<IoObjectService>(io_context))
  {
    service_->construct(implementation_);
  }